

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.hpp
# Opt level: O0

void __thiscall
TasOptimization::ParticleSwarmState::setParticleVelocities
          (ParticleSwarmState *this,vector<double,_std::allocator<double>_> *pv)

{
  size_type sVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *pv_local;
  ParticleSwarmState *this_local;
  
  local_18 = pv;
  pv_local = (vector<double,_std::allocator<double>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ParticleSwarmState::setParticleVelocities",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"particle velocities",&local_71);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(local_18);
  checkVarSize(&local_38,&local_70,(int)sVar1,this->num_dimensions * this->num_particles);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::operator=(&this->particle_velocities,local_18);
  this->velocities_initialized = true;
  return;
}

Assistant:

void setParticleVelocities(const std::vector<double> &pv) {
        checkVarSize("ParticleSwarmState::setParticleVelocities", "particle velocities", pv.size(), num_dimensions * num_particles);
        particle_velocities = pv;
        velocities_initialized = true;
    }